

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O0

void ImVector_ImVec2_resize(ImVector_ImVec2 *self,int new_size)

{
  int new_size_local;
  ImVector_ImVec2 *self_local;
  
  ImVector<ImVec2>::resize(self,new_size);
  return;
}

Assistant:

CIMGUI_API void ImVector_ImVec2_resize(ImVector_ImVec2* self,int new_size)
{
    return self->resize(new_size);
}